

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_forward(writer *w,TypeDef *type)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  bool bVar1;
  category cVar2;
  TypeSig *args_1;
  bool local_2d1;
  basic_string_view<char,_std::char_traits<char>_> local_2b0;
  anon_class_8_1_89897ddb local_2a0;
  basic_string_view<char,_std::char_traits<char>_> local_298;
  char *local_288;
  char *format;
  char *local_270;
  char *format_2;
  pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> generics;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_228;
  char *local_218;
  char *local_210;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_208;
  char *local_1f8;
  char *local_1f0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1e8;
  char *local_1d8;
  char *local_1d0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1c8;
  char *local_1b8;
  char *local_1b0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1a8;
  char *local_198;
  char *local_190;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_188;
  char *local_178;
  char *local_170;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_168;
  char *local_158;
  char *local_150;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  basic_string_view<char,_std::char_traits<char>_> local_138 [2];
  pair<winmd::reader::Field,_winmd::reader::Field> local_118;
  FieldSig local_f8;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  char *local_40;
  char *format_1;
  type_name type_name;
  TypeDef *type_local;
  writer *w_local;
  
  type_name.name_space._M_str = (char *)type;
  cppwinrt::type_name::type_name((type_name *)&format_1,type);
  cVar2 = winmd::reader::get_category((TypeDef *)type_name.name_space._M_str);
  if (cVar2 == enum_type) {
    local_40 = "    enum class % : %;\n";
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_50,"    enum class % : %;\n");
    winmd::reader::TypeDef::FieldList(&local_118,(TypeDef *)type_name.name_space._M_str);
    winmd::reader::Field::Signature(&local_f8,&local_118.first);
    args_1 = winmd::reader::FieldSig::Type(&local_f8);
    writer_base<cppwinrt::writer>::
    write<std::basic_string_view<char,std::char_traits<char>>,winmd::reader::TypeSig>
              (&w->super_writer_base<cppwinrt::writer>,&local_50,
               (basic_string_view<char,_std::char_traits<char>_> *)&format_1,args_1);
    winmd::reader::FieldSig::~FieldSig(&local_f8);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_138,"Windows.Foundation.DateTime");
    bVar1 = operator==((type_name *)&format_1,local_138);
    local_2d1 = true;
    if (!bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_148,"Windows.Foundation.TimeSpan");
      local_2d1 = operator==((type_name *)&format_1,&local_148);
    }
    if (local_2d1 == false) {
      local_158 = type_name.name._M_str;
      local_150 = (char *)type_name.name_space._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_168,"Windows.Foundation.Numerics");
      __x_06._M_str = local_150;
      __x_06._M_len = (size_t)local_158;
      bVar1 = ::std::operator==(__x_06,local_168);
      if (bVar1) {
        local_178 = format_1;
        local_170 = (char *)type_name.name._M_len;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_188,"Matrix3x2");
        __x_05._M_str = local_170;
        __x_05._M_len = (size_t)local_178;
        bVar1 = ::std::operator==(__x_05,local_188);
        if (bVar1) {
          return;
        }
        local_198 = format_1;
        local_190 = (char *)type_name.name._M_len;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_1a8,"Matrix4x4");
        __x_04._M_str = local_190;
        __x_04._M_len = (size_t)local_198;
        bVar1 = ::std::operator==(__x_04,local_1a8);
        if (bVar1) {
          return;
        }
        local_1b8 = format_1;
        local_1b0 = (char *)type_name.name._M_len;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c8,"Plane")
        ;
        __x_03._M_str = local_1b0;
        __x_03._M_len = (size_t)local_1b8;
        bVar1 = ::std::operator==(__x_03,local_1c8);
        if (bVar1) {
          return;
        }
        local_1d8 = format_1;
        local_1d0 = (char *)type_name.name._M_len;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_1e8,"Quaternion");
        __x_02._M_str = local_1d0;
        __x_02._M_len = (size_t)local_1d8;
        bVar1 = ::std::operator==(__x_02,local_1e8);
        if (bVar1) {
          return;
        }
        local_1f8 = format_1;
        local_1f0 = (char *)type_name.name._M_len;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_208,"Vector2");
        __x_01._M_str = local_1f0;
        __x_01._M_len = (size_t)local_1f8;
        bVar1 = ::std::operator==(__x_01,local_208);
        if (bVar1) {
          return;
        }
        local_218 = format_1;
        local_210 = (char *)type_name.name._M_len;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_228,"Vector3");
        __x_00._M_str = local_210;
        __x_00._M_len = (size_t)local_218;
        bVar1 = ::std::operator==(__x_00,local_228);
        if (bVar1) {
          return;
        }
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   &generics.second.super_row_base<winmd::reader::GenericParam>.m_index,"Vector4");
        __x._M_str = (char *)type_name.name._M_len;
        __x._M_len = (size_t)format_1;
        bVar1 = ::std::operator==(__x,stack0xfffffffffffffdb8);
        if (bVar1) {
          return;
        }
      }
      winmd::reader::TypeDef::GenericParam
                ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&format_2,
                 (TypeDef *)type_name.name_space._M_str);
      bVar1 = winmd::reader::empty<winmd::reader::GenericParam>
                        ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&format_2
                        );
      if (bVar1) {
        local_270 = "    struct %;\n";
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&format,"    struct %;\n");
        writer_base<cppwinrt::writer>::write<std::basic_string_view<char,std::char_traits<char>>>
                  (&w->super_writer_base<cppwinrt::writer>,(string_view *)&format,
                   (basic_string_view<char,_std::char_traits<char>_> *)&format_1);
      }
      else {
        local_288 = "    template <%> struct WINRT_IMPL_EMPTY_BASES %;\n";
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_298,"    template <%> struct WINRT_IMPL_EMPTY_BASES %;\n");
        local_2a0 = bind<&cppwinrt::write_generic_typenames,_std::pair<winmd::reader::GenericParam,_winmd::reader::GenericParam>_&>
                              ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)
                               &format_2);
        local_2b0 = remove_tick((string_view *)&format_1);
        writer_base<cppwinrt::writer>::
        write<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>_>
                  (&w->super_writer_base<cppwinrt::writer>,&local_298,&local_2a0,&local_2b0);
      }
    }
  }
  return;
}

Assistant:

static void write_forward(writer& w, TypeDef const& type)
    {
        type_name type_name(type);

        if (get_category(type) == category::enum_type)
        {
            auto format = R"(    enum class % : %;
)";

            w.write(format, type_name.name, type.FieldList().first.Signature().Type());
            return;
        }

        if (type_name == "Windows.Foundation.DateTime" ||
            type_name == "Windows.Foundation.TimeSpan")
        {
            // Don't forward declare these since they're not structs.
            return;
        }

        if (type_name.name_space == "Windows.Foundation.Numerics")
        {
            if (type_name.name == "Matrix3x2" ||
                type_name.name == "Matrix4x4" ||
                type_name.name == "Plane" ||
                type_name.name == "Quaternion" ||
                type_name.name == "Vector2" ||
                type_name.name == "Vector3" ||
                type_name.name == "Vector4")
            {
                // Don't forward declare these since they're already defined with different names.
                return;
            }
        }

        auto generics = type.GenericParam();

        if (empty(generics))
        {
            auto format = R"(    struct %;
)";

            w.write(format, type_name.name);
            return;
        }

        auto format = R"(    template <%> struct WINRT_IMPL_EMPTY_BASES %;
)";

        w.write(format,
            bind<write_generic_typenames>(generics),
            remove_tick(type_name.name));
    }